

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O1

void __thiscall
flatbuffers::JsonPrinter::PrintScalar<double>(JsonPrinter *this,double val,Type *type,int param_3)

{
  EnumDef *this_00;
  size_type sVar1;
  pointer ppEVar2;
  ulong uVar3;
  string *psVar4;
  EnumVal *pEVar5;
  const_iterator cVar6;
  ulong uVar7;
  pointer ppEVar8;
  ulong uVar9;
  bool bVar10;
  key_type local_70;
  string local_50;
  
  if (type->base_type == BASE_TYPE_BOOL) {
    std::__cxx11::string::append((char *)this->text);
    return;
  }
  if ((this->opts->output_enum_identifiers != true) ||
     (this_00 = type->enum_def, this_00 == (EnumDef *)0x0)) goto LAB_0014a37f;
  pEVar5 = EnumDef::ReverseLookup(this_00,(long)val,false);
  if (pEVar5 != (EnumVal *)0x0) {
    std::__cxx11::string::push_back((char)this->text);
    std::__cxx11::string::_M_append((char *)this->text,(ulong)(pEVar5->name)._M_dataplus._M_p);
    std::__cxx11::string::push_back((char)this->text);
    return;
  }
  if ((val != 0.0) || (NAN(val))) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"bit_flags","");
    cVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                    *)&(this_00->super_Definition).attributes,&local_70);
    if ((_Rb_tree_header *)cVar6._M_node ==
        &(this_00->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header)
    goto LAB_0014a2a1;
    bVar10 = *(long *)(cVar6._M_node + 2) != 0;
  }
  else {
LAB_0014a2a1:
    bVar10 = false;
  }
  if (((val != 0.0) || (NAN(val))) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2)) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (bVar10) {
    sVar1 = this->text->_M_string_length;
    uVar7 = (long)(val - 9.223372036854776e+18) & (long)val >> 0x3f | (long)val;
    std::__cxx11::string::push_back((char)this->text);
    ppEVar2 = (this_00->vals).vec.
              super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    uVar9 = 0;
    for (ppEVar8 = (this_00->vals).vec.
                   super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppEVar8 != ppEVar2;
        ppEVar8 = ppEVar8 + 1) {
      uVar3 = (*ppEVar8)->value;
      if ((uVar3 & uVar7) != 0) {
        uVar9 = uVar9 | uVar3;
        std::__cxx11::string::_M_append
                  ((char *)this->text,(ulong)((*ppEVar8)->name)._M_dataplus._M_p);
        std::__cxx11::string::push_back((char)this->text);
      }
    }
    psVar4 = this->text;
    if (uVar9 != 0 && uVar9 == uVar7) {
      (psVar4->_M_dataplus)._M_p[psVar4->_M_string_length - 1] = '\"';
      return;
    }
    std::__cxx11::string::resize((ulong)psVar4,(char)sVar1);
  }
LAB_0014a37f:
  FloatToString<double>(&local_50,val,0xc);
  std::__cxx11::string::_M_append((char *)this->text,(ulong)local_50._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void PrintScalar(T val, const Type &type, int /*indent*/) {
    if (IsBool(type.base_type)) {
      text += val != 0 ? "true" : "false";
      return;  // done
    }

    if (opts.output_enum_identifiers && type.enum_def) {
      const auto &enum_def = *type.enum_def;
      if (auto ev = enum_def.ReverseLookup(static_cast<int64_t>(val))) {
        text += '\"';
        text += ev->name;
        text += '\"';
        return;  // done
      } else if (val && enum_def.attributes.Lookup("bit_flags")) {
        const auto entry_len = text.length();
        const auto u64 = static_cast<uint64_t>(val);
        uint64_t mask = 0;
        text += '\"';
        for (auto it = enum_def.Vals().begin(), e = enum_def.Vals().end();
             it != e; ++it) {
          auto f = (*it)->GetAsUInt64();
          if (f & u64) {
            mask |= f;
            text += (*it)->name;
            text += ' ';
          }
        }
        // Don't slice if (u64 != mask)
        if (mask && (u64 == mask)) {
          text[text.length() - 1] = '\"';
          return;  // done
        }
        text.resize(entry_len);  // restore
      }
      // print as numeric value
    }

    text += NumToString(val);
    return;
  }